

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_block_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_21bf54d::ErrorBlockTest_OperationCheck_Test::TestBody
          (ErrorBlockTest_OperationCheck_Test *this)

{
  uint uVar1;
  undefined8 *puVar2;
  ErrorBlockTest_OperationCheck_Test *pEVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  int64_t iVar6;
  int64_t iVar7;
  uint uVar8;
  uint32_t range;
  ulong uVar9;
  SEARCH_METHODS *message;
  uint uVar10;
  ulong uVar11;
  int j;
  ulong uVar12;
  undefined2 in_FPUControlWord;
  uint16_t in_FPUTagWord;
  undefined8 in_FPUInstructionPointer;
  int err_count_total;
  RegisterStateCheckMMX reg_check_mmx;
  int64_t ref_ssz;
  int64_t ssz;
  ACMRandom rnd;
  tran_low_t coeff [4096];
  tran_low_t dqcoeff [4096];
  Message local_80a0;
  uint local_8094;
  AssertHelper local_8090;
  uint local_8084;
  ErrorBlockTest_OperationCheck_Test *local_8080;
  ulong local_8078;
  RegisterStateCheckMMX local_8070;
  long local_8050;
  long local_8048;
  Random local_803c;
  uint32_t local_8038 [4096];
  uint32_t local_4038 [4098];
  
  local_803c.state_ = 0xbaba;
  local_8094 = 0;
  range = 1 << ((char)(this->super_ErrorBlockTest).bit_depth_ + 7 & 0x1f);
  uVar10 = 0xffffffff;
  uVar9 = 0;
  uVar8 = 0;
  local_8080 = this;
  do {
    uVar11 = (ulong)(uint)(0x10 << ((char)uVar8 + (char)((uVar8 & 0xffff) / 9) * -9 & 0x1fU));
    uVar12 = 0;
    local_8084 = uVar10;
    local_8078 = uVar9;
    do {
      uVar4 = testing::internal::Random::Generate(&local_803c,2);
      uVar5 = testing::internal::Random::Generate(&local_803c,range);
      if (uVar4 == 0) {
        local_8038[uVar12] = -uVar5;
        uVar4 = testing::internal::Random::Generate(&local_803c,range);
        uVar4 = -uVar4;
      }
      else {
        local_8038[uVar12] = uVar5;
        uVar4 = testing::internal::Random::Generate(&local_803c,range);
      }
      pEVar3 = local_8080;
      local_4038[uVar12] = uVar4;
      uVar12 = uVar12 + 1;
    } while (uVar11 != uVar12);
    iVar6 = (*(local_8080->super_ErrorBlockTest).ref_error_block_op_)
                      ((tran_low_t *)local_8038,(tran_low_t *)local_4038,uVar11,&local_8050,
                       (local_8080->super_ErrorBlockTest).bit_depth_);
    local_8070.pre_fpu_env_[0]._0_1_ = SUB21(in_FPUControlWord,0);
    local_8070.pre_fpu_env_._12_4_ = SUB84(in_FPUInstructionPointer,0);
    local_8070.pre_fpu_env_[8] = (uint16_t)((ulong)in_FPUInstructionPointer >> 0x20);
    local_8070.pre_fpu_env_[4] = in_FPUTagWord;
    iVar7 = (*(pEVar3->super_ErrorBlockTest).error_block_op_)
                      ((tran_low_t *)local_8038,(tran_low_t *)local_4038,uVar11,&local_8048,
                       (pEVar3->super_ErrorBlockTest).bit_depth_);
    libaom_test::RegisterStateCheckMMX::Check(&local_8070);
    uVar1 = local_8084;
    if ((int)local_8078 == 0) {
      uVar1 = uVar8;
    }
    uVar10 = local_8084;
    if (local_8050 != local_8048 || iVar6 != iVar7) {
      uVar10 = uVar1;
    }
    local_8094 = (int)local_8078 + (uint)(local_8050 != local_8048 || iVar6 != iVar7);
    uVar9 = (ulong)local_8094;
    uVar8 = uVar8 + 1;
  } while (uVar8 != 1000);
  local_80a0.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 0;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_8070,"0","err_count_total",(int *)&local_80a0,(int *)&local_8094);
  if (local_8070.pre_fpu_env_[0]._0_1_ == (internal)0x0) {
    testing::Message::Message(&local_80a0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               (CONCAT44(local_80a0.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         local_80a0.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_4_) + 0x10),
               "Error: Error Block Test, C output doesn\'t match optimized output. ",0x42);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               (CONCAT44(local_80a0.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         local_80a0.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_4_) + 0x10),"First failed at test case ",0x1a);
    std::ostream::operator<<
              ((void *)(CONCAT44(local_80a0.ss_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl._4_4_,
                                 local_80a0.ss_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl._0_4_) + 0x10),uVar10);
    puVar2 = (undefined8 *)
             CONCAT44(local_8070.pre_fpu_env_._12_4_,
                      CONCAT22(local_8070.pre_fpu_env_[5],local_8070.pre_fpu_env_[4]));
    if (puVar2 == (undefined8 *)0x0) {
      message = "";
    }
    else {
      message = (SEARCH_METHODS *)*puVar2;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_8090,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/error_block_test.cc"
               ,0x78,(char *)message);
    testing::internal::AssertHelper::operator=(&local_8090,&local_80a0);
    testing::internal::AssertHelper::~AssertHelper(&local_8090);
    if ((long *)CONCAT44(local_80a0.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         local_80a0.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_80a0.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     local_80a0.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_4_) + 8))();
    }
  }
  puVar2 = (undefined8 *)
           CONCAT44(local_8070.pre_fpu_env_._12_4_,
                    CONCAT22(local_8070.pre_fpu_env_[5],local_8070.pre_fpu_env_[4]));
  if (puVar2 != (undefined8 *)0x0) {
    if ((undefined8 *)*puVar2 != puVar2 + 2) {
      operator_delete((undefined8 *)*puVar2);
    }
    operator_delete(puVar2);
  }
  return;
}

Assistant:

TEST_P(ErrorBlockTest, OperationCheck) {
  ACMRandom rnd(ACMRandom::DeterministicSeed());
  DECLARE_ALIGNED(16, tran_low_t, coeff[4096]);
  DECLARE_ALIGNED(16, tran_low_t, dqcoeff[4096]);
  int err_count_total = 0;
  int first_failure = -1;
  intptr_t block_size;
  int64_t ssz;
  int64_t ret;
  int64_t ref_ssz;
  int64_t ref_ret;
  const int msb = bit_depth_ + 8 - 1;
  for (int i = 0; i < kNumIterations; ++i) {
    int err_count = 0;
    block_size = 16 << (i % 9);  // All block sizes from 4x4, 8x4 ..64x64
    for (int j = 0; j < block_size; j++) {
      // coeff and dqcoeff will always have at least the same sign, and this
      // can be used for optimization, so generate test input precisely.
      if (rnd(2)) {
        // Positive number
        coeff[j] = rnd(1 << msb);
        dqcoeff[j] = rnd(1 << msb);
      } else {
        // Negative number
        coeff[j] = -rnd(1 << msb);
        dqcoeff[j] = -rnd(1 << msb);
      }
    }
    ref_ret =
        ref_error_block_op_(coeff, dqcoeff, block_size, &ref_ssz, bit_depth_);
    API_REGISTER_STATE_CHECK(
        ret = error_block_op_(coeff, dqcoeff, block_size, &ssz, bit_depth_));
    err_count += (ref_ret != ret) | (ref_ssz != ssz);
    if (err_count && !err_count_total) {
      first_failure = i;
    }
    err_count_total += err_count;
  }
  EXPECT_EQ(0, err_count_total)
      << "Error: Error Block Test, C output doesn't match optimized output. "
      << "First failed at test case " << first_failure;
}